

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

string * __thiscall
pstack::Reader::readString_abi_cxx11_(string *__return_storage_ptr__,Reader *this,Off offset)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char local_41;
  ulong uStack_40;
  char c;
  Off s;
  allocator<char> local_21;
  Off local_20;
  Off offset_local;
  Reader *this_local;
  string *res;
  
  local_20 = offset;
  offset_local = (Off)this;
  this_local = (Reader *)__return_storage_ptr__;
  if (offset == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(null)",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    s._3_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    iVar1 = (*this->_vptr_Reader[8])();
    uStack_40 = CONCAT44(extraout_var,iVar1);
    while (((local_20 < uStack_40 &&
            (iVar1 = (*this->_vptr_Reader[2])(this,local_20,1,&local_41),
            CONCAT44(extraout_var_00,iVar1) == 1)) && (local_41 != '\0'))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,local_41);
      local_20 = local_20 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string
Reader::readString(Off offset) const
{
    if (offset == 0)
        return "(null)";
    string res;
    for (Off s = size(); offset < s; ++offset) {
        char c;
        if (read(offset, 1, &c) != 1)
            break;
        if (c == 0)
            break;
        res += c;
    }
    return res;
}